

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_json_transaction.cpp
# Opt level: O0

vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> *
cfd::api::json::TransactionJsonApi::ConvertFromLockingScript
          (AddressFactory *factory,Script *script,string *script_type,int64_t *require_num)

{
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  string *in_RCX;
  Script *in_RDX;
  Address *in_RSI;
  vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> *in_RDI;
  size_type *in_R8;
  CfdException *anon_var_0;
  ByteData160 hash_1;
  ByteData160 hash;
  Pubkey pubkey_1;
  Pubkey pubkey;
  ByteData pubkey_bytes;
  iterator __end3;
  iterator __begin3;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *__range3;
  Address address;
  string type_str;
  LockingScriptType type;
  ExtractScriptData extract_data;
  vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> *addr_list;
  undefined4 in_stack_fffffffffffff398;
  WitnessVersion in_stack_fffffffffffff39c;
  Address *in_stack_fffffffffffff3a0;
  value_type *in_stack_fffffffffffff3a8;
  allocator *in_stack_fffffffffffff3b0;
  LockingScriptType in_stack_fffffffffffff42c;
  Script *in_stack_fffffffffffff4f8;
  Address local_ab0;
  Address local_938;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_7c0;
  ByteData160 local_7a8;
  Address local_790;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_618;
  ByteData160 local_600;
  Address local_5e8;
  ByteData local_470;
  Pubkey local_458;
  Address local_440;
  ByteData local_2c8;
  Pubkey local_2b0 [2];
  __normal_iterator<cfd::core::ByteData_*,_std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>_>
  local_280;
  __normal_iterator<cfd::core::ByteData_*,_std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>_>
  local_278;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *local_270;
  Address local_268;
  byte local_e9;
  string local_e8 [39];
  allocator local_c1;
  string local_c0 [32];
  int local_a0;
  Script local_90;
  int local_58;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_50;
  size_type local_38;
  size_type *local_28;
  string *local_20;
  Address *local_10;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_10 = in_RSI;
  core::Script::Script(&local_90,in_RDX);
  ExtractLockingScript(in_stack_fffffffffffff4f8);
  core::Script::~Script((Script *)in_stack_fffffffffffff3a0);
  local_a0 = local_58;
  if (local_20 != (string *)0x0) {
    in_stack_fffffffffffff3b0 = &local_c1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c0,"nonstandard",in_stack_fffffffffffff3b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_c1);
    if (local_a0 != 0xb) {
      ConvertLockingScriptTypeString_abi_cxx11_(in_stack_fffffffffffff42c);
      std::__cxx11::string::operator=(local_c0,local_e8);
      std::__cxx11::string::~string(local_e8);
    }
    std::__cxx11::string::operator=(local_20,local_c0);
    std::__cxx11::string::~string(local_c0);
  }
  if (local_28 != (size_type *)0x0) {
    sVar2 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::size(&local_50);
    *local_28 = sVar2;
  }
  local_e9 = 0;
  std::vector<cfd::core::Address,_std::allocator<cfd::core::Address>_>::vector(in_RDI);
  core::Address::Address(&local_268);
  if (local_a0 == 4) {
    if (local_28 != (size_type *)0x0) {
      *local_28 = local_38;
    }
    local_270 = &local_50;
    local_278._M_current =
         (ByteData *)
         std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::begin(local_270);
    local_280._M_current =
         (ByteData *)
         std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::end(local_270);
    while (bVar1 = __gnu_cxx::operator!=(&local_278,&local_280), bVar1) {
      __gnu_cxx::
      __normal_iterator<cfd::core::ByteData_*,_std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>_>
      ::operator*(&local_278);
      core::ByteData::ByteData
                ((ByteData *)in_stack_fffffffffffff3a0,
                 (ByteData *)CONCAT44(in_stack_fffffffffffff39c,in_stack_fffffffffffff398));
      core::ByteData::ByteData
                ((ByteData *)in_stack_fffffffffffff3a0,
                 (ByteData *)CONCAT44(in_stack_fffffffffffff39c,in_stack_fffffffffffff398));
      core::Pubkey::Pubkey(local_2b0,&local_2c8);
      core::ByteData::~ByteData((ByteData *)0x6969c4);
      AddressFactory::CreateP2pkhAddress
                ((AddressFactory *)in_stack_fffffffffffff3a8,(Pubkey *)in_stack_fffffffffffff3a0);
      core::Address::operator=(&local_268,&local_440);
      core::Address::~Address(in_stack_fffffffffffff3a0);
      std::vector<cfd::core::Address,_std::allocator<cfd::core::Address>_>::push_back
                ((vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> *)
                 in_stack_fffffffffffff3b0,in_stack_fffffffffffff3a8);
      core::Pubkey::~Pubkey((Pubkey *)0x696a28);
      core::ByteData::~ByteData((ByteData *)0x696a35);
      __gnu_cxx::
      __normal_iterator<cfd::core::ByteData_*,_std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>_>
      ::operator++(&local_278);
    }
  }
  else if (local_a0 == 1) {
    std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator[](&local_50,0);
    core::ByteData::ByteData
              ((ByteData *)in_stack_fffffffffffff3a0,
               (ByteData *)CONCAT44(in_stack_fffffffffffff39c,in_stack_fffffffffffff398));
    core::Pubkey::Pubkey(&local_458,&local_470);
    core::ByteData::~ByteData((ByteData *)0x696b49);
    AddressFactory::CreateP2pkhAddress
              ((AddressFactory *)in_stack_fffffffffffff3a8,(Pubkey *)in_stack_fffffffffffff3a0);
    core::Address::operator=(&local_268,&local_5e8);
    core::Address::~Address(in_stack_fffffffffffff3a0);
    std::vector<cfd::core::Address,_std::allocator<cfd::core::Address>_>::push_back
              ((vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> *)
               in_stack_fffffffffffff3b0,in_stack_fffffffffffff3a8);
    core::Pubkey::~Pubkey((Pubkey *)0x696bad);
  }
  else if (local_a0 == 2) {
    pvVar3 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator[]
                       (&local_50,0);
    core::ByteData::GetBytes(&local_618,pvVar3);
    core::ByteData160::ByteData160(&local_600,&local_618);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff3b0);
    AddressFactory::GetAddressByHash
              ((AddressFactory *)in_stack_fffffffffffff3a8,
               (AddressType)((ulong)in_stack_fffffffffffff3a0 >> 0x20),
               (ByteData160 *)CONCAT44(in_stack_fffffffffffff39c,in_stack_fffffffffffff398));
    core::Address::operator=(&local_268,&local_790);
    core::Address::~Address(in_stack_fffffffffffff3a0);
    std::vector<cfd::core::Address,_std::allocator<cfd::core::Address>_>::push_back
              ((vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> *)
               in_stack_fffffffffffff3b0,in_stack_fffffffffffff3a8);
    core::ByteData160::~ByteData160((ByteData160 *)0x696cdf);
  }
  else if (local_a0 == 3) {
    pvVar3 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator[]
                       (&local_50,0);
    core::ByteData::GetBytes(&local_7c0,pvVar3);
    core::ByteData160::ByteData160(&local_7a8,&local_7c0);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff3b0);
    AddressFactory::GetAddressByHash
              ((AddressFactory *)in_stack_fffffffffffff3a8,
               (AddressType)((ulong)in_stack_fffffffffffff3a0 >> 0x20),
               (ByteData160 *)CONCAT44(in_stack_fffffffffffff39c,in_stack_fffffffffffff398));
    core::Address::operator=(&local_268,&local_938);
    core::Address::~Address(in_stack_fffffffffffff3a0);
    std::vector<cfd::core::Address,_std::allocator<cfd::core::Address>_>::push_back
              ((vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> *)
               in_stack_fffffffffffff3b0,in_stack_fffffffffffff3a8);
    core::ByteData160::~ByteData160((ByteData160 *)0x696e11);
  }
  else if (((local_a0 == 7) || (local_a0 == 6)) || (local_a0 == 8)) {
    std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator[](&local_50,0);
    AddressFactory::GetSegwitAddressByHash
              ((AddressFactory *)local_10,(ByteData *)in_stack_fffffffffffff3a0,
               in_stack_fffffffffffff39c);
    core::Address::operator=(&local_268,&local_ab0);
    core::Address::~Address(in_stack_fffffffffffff3a0);
    std::vector<cfd::core::Address,_std::allocator<cfd::core::Address>_>::push_back
              ((vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> *)
               in_stack_fffffffffffff3b0,local_10);
  }
  else if (local_a0 == 9) {
    std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator[](&local_50,0);
    AddressFactory::GetSegwitAddressByHash
              ((AddressFactory *)in_stack_fffffffffffff3a8,(ByteData *)local_10,
               in_stack_fffffffffffff39c);
    core::Address::operator=(&local_268,(Address *)&stack0xfffffffffffff3d8);
    core::Address::~Address(local_10);
    std::vector<cfd::core::Address,_std::allocator<cfd::core::Address>_>::push_back
              ((vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> *)
               in_stack_fffffffffffff3b0,in_stack_fffffffffffff3a8);
    in_stack_fffffffffffff3a0 = local_10;
  }
  local_e9 = 1;
  core::Address::~Address(in_stack_fffffffffffff3a0);
  if ((local_e9 & 1) == 0) {
    std::vector<cfd::core::Address,_std::allocator<cfd::core::Address>_>::~vector
              ((vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> *)
               in_stack_fffffffffffff3b0);
  }
  ExtractScriptData::~ExtractScriptData((ExtractScriptData *)0x697075);
  return in_RDI;
}

Assistant:

std::vector<Address> TransactionJsonApi::ConvertFromLockingScript(
    const AddressFactory& factory, const Script& script,
    std::string* script_type, int64_t* require_num) {
  ExtractScriptData extract_data =
      TransactionJsonApi::ExtractLockingScript(script);
  LockingScriptType type = extract_data.script_type;
  if (script_type != nullptr) {
    std::string type_str = "nonstandard";
    if (type != LockingScriptType::kFee) {
      type_str = TransactionJsonApi::ConvertLockingScriptTypeString(type);
    }
    *script_type = type_str;
  }
  if (require_num != nullptr) {
    *require_num = static_cast<int64_t>(extract_data.pushed_datas.size());
  }

  std::vector<Address> addr_list;
  Address address;
  if (type == LockingScriptType::kMultisig) {
    if (require_num != nullptr) {
      *require_num = extract_data.req_sigs;
    }
    for (ByteData pubkey_bytes : extract_data.pushed_datas) {
      Pubkey pubkey = Pubkey(pubkey_bytes);
      address = factory.CreateP2pkhAddress(pubkey);
      addr_list.push_back(address);
    }
  } else if (type == LockingScriptType::kPayToPubkey) {
    Pubkey pubkey = Pubkey(extract_data.pushed_datas[0]);
    address = factory.CreateP2pkhAddress(pubkey);
    addr_list.push_back(address);
  } else if (type == LockingScriptType::kPayToPubkeyHash) {
    ByteData160 hash =
        ByteData160(extract_data.pushed_datas[0].GetBytes());
    address = factory.GetAddressByHash(
        AddressType::kP2pkhAddress, hash);
    addr_list.push_back(address);
  } else if (type == LockingScriptType::kPayToScriptHash) {
    ByteData160 hash =
        ByteData160(extract_data.pushed_datas[0].GetBytes());
    address = factory.GetAddressByHash(
        AddressType::kP2shAddress, hash);
    addr_list.push_back(address);
  } else if ((type == LockingScriptType::kWitnessV0KeyHash) ||
      (type == LockingScriptType::kWitnessV0ScriptHash) ||
      (type == LockingScriptType::kWitnessV1Taproot)) {
    address = factory.GetSegwitAddressByHash(
          extract_data.pushed_datas[0], extract_data.witness_version);
    addr_list.push_back(address);
  } else if (type == LockingScriptType::kWitnessUnknown) {
    try {
      address = factory.GetSegwitAddressByHash(
            extract_data.pushed_datas[0], extract_data.witness_version);
      addr_list.push_back(address);
    } catch (const CfdException&) {
      // If the data is invalid, it will not be output.
    }
  } else {
    // do nothing
  }
  return addr_list;
}